

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

int str_upper(lua_State *L)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  __int32_t **pp_Var4;
  ulong uVar5;
  size_t l;
  luaL_Buffer b;
  ulong local_2040;
  luaL_Buffer local_2038;
  
  pcVar3 = luaL_checklstring(L,1,&local_2040);
  local_2038.lvl = 0;
  local_2038.p = local_2038.buffer;
  local_2038.L = L;
  if (local_2040 != 0) {
    uVar5 = 0;
    do {
      if (&stack0xffffffffffffffe0 <= local_2038.p) {
        iVar2 = emptybuffer(&local_2038);
        if (iVar2 != 0) {
          adjuststack(&local_2038);
        }
      }
      pp_Var4 = __ctype_toupper_loc();
      pcVar1 = local_2038.p + 1;
      *local_2038.p = (char)(*pp_Var4)[(byte)pcVar3[uVar5]];
      uVar5 = uVar5 + 1;
      local_2038.p = pcVar1;
    } while (uVar5 < local_2040);
  }
  emptybuffer(&local_2038);
  lua_concat(local_2038.L,local_2038.lvl);
  return 1;
}

Assistant:

static int str_upper(lua_State*L){
size_t l;
size_t i;
luaL_Buffer b;
const char*s=luaL_checklstring(L,1,&l);
luaL_buffinit(L,&b);
for(i=0;i<l;i++)
luaL_addchar(&b,toupper(uchar(s[i])));
luaL_pushresult(&b);
return 1;
}